

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O1

void __thiscall Spectrum_Blackbody_Test::TestBody(Spectrum_Blackbody_Test *this)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  float n2_1;
  float fVar6;
  float n2;
  float fVar7;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  float local_60;
  float local_5c;
  float local_58 [3];
  float local_4c;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  double local_38;
  
  lVar3 = 8;
  do {
    fVar7 = 0.0;
    fVar6 = *(float *)((long)&DAT_005d9060 + lVar3);
    if (0.0 < *(float *)(&UNK_005d905c + lVar3)) {
      fVar6 = *(float *)(&UNK_005d9058 + lVar3) * 1e-09;
      local_60 = fVar6 * fVar6 * fVar6 * fVar6 * fVar6;
      local_5c = *(float *)((long)&DAT_005d9060 + lVar3);
      fVar6 = expf(1.9864457e-25 / (*(float *)(&UNK_005d905c + lVar3) * fVar6 * 1.3806487e-23));
      fVar7 = 1.1910428e-16 / ((fVar6 + -1.0) * local_60);
      fVar6 = local_5c;
      if (NAN(fVar7)) goto LAB_003236f0;
    }
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(ZEXT416((uint)(fVar7 - fVar6)),auVar5);
    local_58[0] = auVar5._0_4_ / fVar6;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3f50624dd2f1a9fc;
    testing::internal::CmpHelperLT<float,double>
              (local_48,"err(Blackbody(lambda, T), LeExpected)",".001",local_58,(double *)&local_68)
    ;
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x24,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x38);
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)&DAT_005d9090 + lVar3);
    local_5c = (float)iVar1;
    local_60 = (0.002897772 / (float)iVar1) * 1e+09;
    local_38 = (double)local_60 * 1.001;
    if (iVar1 < 1) {
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
LAB_003234a0:
      fVar6 = 0.0;
    }
    else {
      fVar6 = (float)((double)local_60 * 0.999) * 1e-09;
      local_4c = fVar6 * fVar6 * fVar6 * fVar6 * fVar6;
      fVar6 = expf(1.9864457e-25 / (fVar6 * 1.3806487e-23 * local_5c));
      fVar6 = 1.1910428e-16 / ((fVar6 + -1.0) * local_4c);
      if (NAN(fVar6)) {
LAB_003236f0:
        pbrt::LogFatal<char_const(&)[11]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.h"
                   ,0x4c,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
      }
      local_68.ptr_._0_4_ = fVar6;
      if (iVar1 < 1) goto LAB_003234a0;
      fVar6 = local_60 * 1e-09;
      local_4c = fVar6 * fVar6 * fVar6 * fVar6 * fVar6;
      fVar6 = expf(1.9864457e-25 / (fVar6 * 1.3806487e-23 * local_5c));
      fVar6 = 1.1910428e-16 / ((fVar6 + -1.0) * local_4c);
      if (NAN(fVar6)) goto LAB_003236f0;
    }
    local_58[0] = fVar6;
    testing::internal::CmpHelperLT<float,float>
              (local_48,"Blackbody(lambda[0], T)","Blackbody(lambda[1], T)",(float *)&local_68,
               local_58);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x2d,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 < 1) {
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
LAB_0032362a:
      fVar6 = 0.0;
    }
    else {
      fVar6 = local_60 * 1e-09;
      local_60 = fVar6 * fVar6 * fVar6 * fVar6 * fVar6;
      fVar6 = expf(1.9864457e-25 / (fVar6 * 1.3806487e-23 * local_5c));
      fVar6 = 1.1910428e-16 / ((fVar6 + -1.0) * local_60);
      if (NAN(fVar6)) goto LAB_003236f0;
      local_68.ptr_._0_4_ = fVar6;
      if (iVar1 < 1) goto LAB_0032362a;
      fVar6 = (float)local_38 * 1e-09;
      local_60 = fVar6 * fVar6 * fVar6 * fVar6 * fVar6;
      fVar6 = expf(1.9864457e-25 / (fVar6 * 1.3806487e-23 * local_5c));
      fVar6 = 1.1910428e-16 / ((fVar6 + -1.0) * local_60);
      if (NAN(fVar6)) goto LAB_003236f0;
    }
    local_58[0] = fVar6;
    testing::internal::CmpHelperGT<float,float>
              (local_48,"Blackbody(lambda[1], T)","Blackbody(lambda[2], T)",(float *)&local_68,
               local_58);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x2e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
    if (lVar3 == 0x14) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Spectrum, Blackbody) {
    // Relative error.
    auto err = [](Float val, Float ref) { return std::abs(val - ref) / ref; };

    // Planck's law.
    // A few values via
    // http://www.spectralcalc.com/blackbody_calculator/blackbody.php
    // lambda, T, expected radiance
    Float v[][3] = {
        {483, 6000, 3.1849e13},
        {600, 6000, 2.86772e13},
        {500, 3700, 1.59845e12},
        {600, 4500, 7.46497e12},
    };
    int n = PBRT_ARRAYSIZE(v);
    for (int i = 0; i < n; ++i) {
        Float lambda = v[i][0], T = v[i][1], LeExpected = v[i][2];
        EXPECT_LT(err(Blackbody(lambda, T), LeExpected), .001);
    }

    // Use Wien's displacement law to compute maximum wavelength for a few
    // temperatures, then confirm that the value returned by Blackbody() is
    // consistent with this.
    for (Float T : {2700, 3000, 4500, 5600, 6000}) {
        Float lambdaMax = 2.8977721e-3 / T * 1e9;
        Float lambda[3] = {Float(.999 * lambdaMax), lambdaMax, Float(1.001 * lambdaMax)};
        EXPECT_LT(Blackbody(lambda[0], T), Blackbody(lambda[1], T));
        EXPECT_GT(Blackbody(lambda[1], T), Blackbody(lambda[2], T));
    }
}